

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttkern.c
# Opt level: O3

FT_Int tt_face_get_kerning(TT_Face face,FT_UInt left_glyph,FT_UInt right_glyph)

{
  FT_UInt count2;
  uint uVar1;
  FT_Byte *pFVar2;
  FT_Int FVar3;
  uint uVar4;
  FT_Byte *pFVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  FT_Byte *pFVar9;
  FT_UInt FVar10;
  FT_ULong key0;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  FT_Byte *pFVar14;
  
  pFVar2 = face->kern_table;
  FVar3 = 0;
  if (pFVar2 != (FT_Byte *)0x0) {
    FVar10 = face->num_kern_tables;
    FVar3 = 0;
    if (9 < (long)face->kern_table_size && FVar10 != 0) {
      pFVar9 = pFVar2 + face->kern_table_size;
      pFVar5 = pFVar2 + 10;
      uVar11 = (ulong)right_glyph | (ulong)left_glyph << 0x10;
      uVar4 = 1;
      FVar3 = 0;
      pFVar2 = pFVar2 + 4;
      do {
        pFVar14 = pFVar2 + (ushort)(*(ushort *)(pFVar2 + 2) << 8 | *(ushort *)(pFVar2 + 2) >> 8);
        if (pFVar9 < pFVar2 + (ushort)(*(ushort *)(pFVar2 + 2) << 8 | *(ushort *)(pFVar2 + 2) >> 8))
        {
          pFVar14 = pFVar9;
        }
        if (((face->kern_avail_bits & uVar4) != 0) && (pFVar2[4] == '\0')) {
          puVar12 = (uint *)(pFVar2 + 0xe);
          uVar1 = (uint)(((long)pFVar14 - (long)puVar12) / 6);
          if ((long)(ulong)((uint)CONCAT11(*pFVar5,pFVar2[7]) * 6) <= (long)pFVar14 - (long)puVar12)
          {
            uVar1 = (uint)CONCAT11(*pFVar5,pFVar2[7]);
          }
          if ((face->kern_order_bits & uVar4) == 0) {
            for (; uVar1 != 0; uVar1 = uVar1 - 1) {
              uVar8 = *puVar12;
              if ((uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18)
                  == uVar11) goto LAB_00244873;
              puVar12 = (uint *)((long)puVar12 + 6);
            }
          }
          else if (uVar1 != 0) {
            uVar8 = 0;
LAB_0024481d:
            uVar6 = (ulong)((uVar1 + uVar8 & 0xfffffffe) * 3);
            uVar7 = *(uint *)((long)puVar12 + uVar6);
            uVar13 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                            uVar7 << 0x18);
            if (uVar13 != uVar11) goto code_r0x00244838;
            puVar12 = (uint *)((long)puVar12 + uVar6);
LAB_00244873:
            if ((pFVar2[5] & 8) != 0) {
              FVar3 = 0;
            }
            FVar3 = FVar3 + ((int)(short)((ushort)(byte)puVar12[1] << 8) |
                            (uint)*(byte *)((long)puVar12 + 5));
          }
        }
LAB_002447af:
        FVar10 = FVar10 - 1;
        if (FVar10 == 0) {
          return FVar3;
        }
        uVar4 = uVar4 * 2;
        pFVar5 = pFVar14 + 6;
        pFVar2 = pFVar14;
      } while (pFVar5 <= pFVar9);
    }
  }
  return FVar3;
code_r0x00244838:
  uVar7 = uVar1 + uVar8 >> 1;
  if (uVar13 < uVar11) {
    uVar8 = uVar7 + 1;
    uVar7 = uVar1;
  }
  uVar1 = uVar7;
  if (uVar1 <= uVar8) goto LAB_002447af;
  goto LAB_0024481d;
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  tt_face_get_kerning( TT_Face  face,
                       FT_UInt  left_glyph,
                       FT_UInt  right_glyph )
  {
    FT_Int   result = 0;
    FT_UInt  count, mask;

    FT_Byte*  p;
    FT_Byte*  p_limit;


    if ( !face->kern_table )
      return result;

    p       = face->kern_table;
    p_limit = p + face->kern_table_size;

    p   += 4;
    mask = 0x0001;

    for ( count = face->num_kern_tables;
          count > 0 && p + 6 <= p_limit;
          count--, mask <<= 1 )
    {
      FT_Byte* base     = p;
      FT_Byte* next;
      FT_UInt  version  = FT_NEXT_USHORT( p );
      FT_UInt  length   = FT_NEXT_USHORT( p );
      FT_UInt  coverage = FT_NEXT_USHORT( p );
      FT_UInt  num_pairs;
      FT_Int   value    = 0;

      FT_UNUSED( version );


      next = base + length;

      if ( next > p_limit )  /* handle broken table */
        next = p_limit;

      if ( ( face->kern_avail_bits & mask ) == 0 )
        goto NextTable;

      FT_ASSERT( p + 8 <= next ); /* tested in tt_face_load_kern */

      num_pairs = FT_NEXT_USHORT( p );
      p        += 6;

      if ( ( next - p ) < 6 * (int)num_pairs )  /* handle broken count  */
        num_pairs = (FT_UInt)( ( next - p ) / 6 );

      switch ( coverage >> 8 )
      {
      case 0:
        {
          FT_ULong  key0 = TT_KERN_INDEX( left_glyph, right_glyph );


          if ( face->kern_order_bits & mask )   /* binary search */
          {
            FT_UInt   min = 0;
            FT_UInt   max = num_pairs;


            while ( min < max )
            {
              FT_UInt   mid = ( min + max ) >> 1;
              FT_Byte*  q   = p + 6 * mid;
              FT_ULong  key;


              key = FT_NEXT_ULONG( q );

              if ( key == key0 )
              {
                value = FT_PEEK_SHORT( q );
                goto Found;
              }
              if ( key < key0 )
                min = mid + 1;
              else
                max = mid;
            }
          }
          else /* linear search */
          {
            FT_UInt  count2;


            for ( count2 = num_pairs; count2 > 0; count2-- )
            {
              FT_ULong  key = FT_NEXT_ULONG( p );


              if ( key == key0 )
              {
                value = FT_PEEK_SHORT( p );
                goto Found;
              }
              p += 2;
            }
          }
        }
        break;

       /*
        * We don't support format 2 because we haven't seen a single font
        * using it in real life...
        */

      default:
        ;
      }

      goto NextTable;

    Found:
      if ( coverage & 8 ) /* override or add */
        result = value;
      else
        result += value;

    NextTable:
      p = next;
    }

    return result;
  }